

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::compileError(SelectionCompiler *this,string *errorMsg)

{
  snprintf(painCave.errMsg,2000,"SelectionCompiler Error: %s\n",(errorMsg->_M_dataplus)._M_p);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  this->error = true;
  std::__cxx11::string::_M_assign((string *)&this->errorMessage);
  return false;
}

Assistant:

bool compileError(const std::string& errorMsg) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SelectionCompiler Error: %s\n", errorMsg.c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();

      error              = true;
      this->errorMessage = errorMsg;
      return false;
    }